

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator *this,cmGlobalGenerator *gen)

{
  char *pcVar1;
  char *__s;
  
  if ((gen->ConfiguredFilesPath)._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&this->ConfiguredFilesPath);
    return;
  }
  __s = cmake::GetHomeOutputDirectory(gen->CMakeInstance);
  pcVar1 = (char *)(this->ConfiguredFilesPath)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->ConfiguredFilesPath,0,pcVar1,(ulong)__s);
  std::__cxx11::string::append((char *)&this->ConfiguredFilesPath);
  return;
}

Assistant:

void cmGlobalGenerator::SetConfiguredFilesPath(cmGlobalGenerator* gen)
{
  if (!gen->ConfiguredFilesPath.empty()) {
    this->ConfiguredFilesPath = gen->ConfiguredFilesPath;
  } else {
    this->ConfiguredFilesPath = gen->CMakeInstance->GetHomeOutputDirectory();
    this->ConfiguredFilesPath += cmake::GetCMakeFilesDirectory();
  }
}